

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmInstructionType
anon_unknown.dwarf_233176::GetLoadInstruction(ExpressionContext *ctx,TypeBase *type)

{
  ulong uVar1;
  bool bVar2;
  
  if (ctx->typeBool == type) {
    return VM_INST_LOAD_BYTE;
  }
  if (ctx->typeChar == type) {
    return VM_INST_LOAD_BYTE;
  }
  if (ctx->typeShort == type) {
    return VM_INST_LOAD_SHORT;
  }
  if (ctx->typeInt == type) {
    return VM_INST_LOAD_INT;
  }
  if (ctx->typeFloat == type) {
    return VM_INST_LOAD_FLOAT;
  }
  if (ctx->typeDouble == type) {
    return VM_INST_LOAD_DOUBLE;
  }
  if (ctx->typeLong == type) {
    return VM_INST_LOAD_LONG;
  }
  if (type != (TypeBase *)0x0) {
    if (type->typeID == 0x12) {
      return VM_INST_LOAD_LONG;
    }
    if (type != (TypeBase *)0x0) {
      if (type->typeID == 0x15) {
        return VM_INST_LOAD_STRUCT;
      }
      if (type != (TypeBase *)0x0) {
        bVar2 = type->typeID == 0x14;
        goto LAB_00289004;
      }
    }
  }
  bVar2 = false;
LAB_00289004:
  if (bVar2) {
    return VM_INST_LOAD_STRUCT;
  }
  if (ctx->typeAutoRef == (TypeStruct *)type) {
    return VM_INST_LOAD_STRUCT;
  }
  if (ctx->typeAutoArray == (TypeStruct *)type) {
    return VM_INST_LOAD_STRUCT;
  }
  if (type != (TypeBase *)0x0) {
    if (type->typeID == 9) {
      return VM_INST_LOAD_INT;
    }
    if (type != (TypeBase *)0x0) {
      if (type->typeID == 10) {
        return VM_INST_LOAD_INT;
      }
      if (type != (TypeBase *)0x0) {
        if (type->typeID == 0x19) {
          return VM_INST_LOAD_INT;
        }
        if ((type != (TypeBase *)0x0) && (type->typeID == 0xb)) {
          return VM_INST_LOAD_LONG;
        }
      }
    }
  }
  uVar1 = type->size;
  if (uVar1 == 0) {
    __assert_fail("type->size != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,400,
                  "VmInstructionType (anonymous namespace)::GetLoadInstruction(ExpressionContext &, TypeBase *)"
                 );
  }
  if ((uVar1 & 3) != 0) {
    __assert_fail("type->size % 4 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x191,
                  "VmInstructionType (anonymous namespace)::GetLoadInstruction(ExpressionContext &, TypeBase *)"
                 );
  }
  if (0xfffffff < (long)uVar1) {
    __assert_fail("type->size < NULLC_MAX_TYPE_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x192,
                  "VmInstructionType (anonymous namespace)::GetLoadInstruction(ExpressionContext &, TypeBase *)"
                 );
  }
  return VM_INST_LOAD_STRUCT;
}

Assistant:

VmInstructionType GetLoadInstruction(ExpressionContext &ctx, TypeBase *type)
	{
		if(type == ctx.typeBool || type == ctx.typeChar)
			return VM_INST_LOAD_BYTE;

		if(type == ctx.typeShort)
			return VM_INST_LOAD_SHORT;

		if(type == ctx.typeInt)
			return VM_INST_LOAD_INT;

		if(type == ctx.typeFloat)
			return VM_INST_LOAD_FLOAT;

		if(type == ctx.typeDouble)
			return VM_INST_LOAD_DOUBLE;

		if(type == ctx.typeLong)
			return VM_INST_LOAD_LONG;

		if(isType<TypeRef>(type))
			return VM_INST_LOAD_POINTER;

		if(isType<TypeFunction>(type))
			return VM_INST_LOAD_STRUCT;

		if(isType<TypeUnsizedArray>(type))
			return VM_INST_LOAD_STRUCT;

		if(type == ctx.typeAutoRef)
			return VM_INST_LOAD_STRUCT;

		if(type == ctx.typeAutoArray)
			return VM_INST_LOAD_STRUCT;

		if(isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeEnum>(type))
			return VM_INST_LOAD_INT;

		if(isType<TypeNullptr>(type))
			return VM_INST_LOAD_POINTER;

		assert(type->size != 0);
		assert(type->size % 4 == 0);
		assert(type->size < NULLC_MAX_TYPE_SIZE);

		return VM_INST_LOAD_STRUCT;
	}